

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_2x1::test_method(test_solvers_2x1 *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  int costs [2];
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_50;
  size_t expected_assignment [2];
  
  costs[0] = 1;
  costs[1] = 0;
  expected_assignment[0] = 1;
  expected_assignment[1] = 0;
  make_matrix<int>(&local_50,costs,2,1);
  make_vector<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,expected_assignment,
             2);
  assert_solvers_result<int>
            (&local_50,0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::~unbounded_array
            (&local_50.data_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_2x1)
{
  const int costs[] = {1,
                       0};
  const std::size_t expected_assignment[] = {1, 0};
  assert_solvers_result(make_matrix(costs, 2, 1), 0, make_vector(expected_assignment, 2));
}